

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchMan.c
# Opt level: O3

void Dch_ManSatSolverRecycle(Dch_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int *piVar4;
  Aig_Obj_t *pAVar5;
  sat_solver *psVar6;
  long lVar7;
  int local_c;
  
  psVar6 = p->pSat;
  if (psVar6 != (sat_solver *)0x0) {
    pVVar2 = p->vUsedNodes;
    if (0 < pVVar2->nSize) {
      ppvVar3 = pVVar2->pArray;
      piVar4 = p->pSatVars;
      lVar7 = 0;
      do {
        piVar4[*(int *)((long)ppvVar3[lVar7] + 0x24)] = 0;
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar2->nSize);
    }
    pVVar2->nSize = 0;
    sat_solver_delete(psVar6);
  }
  psVar6 = sat_solver_new();
  p->pSat = psVar6;
  sat_solver_setnvars(psVar6,1000);
  p->nSatVars = 1;
  local_c = 3 - (uint)(p->pPars->fPolarFlip == 0);
  sat_solver_addclause(p->pSat,&local_c,(lit *)&stack0xfffffffffffffff8);
  pAVar5 = p->pAigFraig->pConst1;
  iVar1 = p->nSatVars;
  p->nSatVars = iVar1 + 1;
  p->pSatVars[pAVar5->Id] = iVar1;
  p->nRecycles = p->nRecycles + 1;
  p->nCallsSince = 0;
  return;
}

Assistant:

void Dch_ManSatSolverRecycle( Dch_Man_t * p )
{
    int Lit;
    if ( p->pSat )
    {
        Aig_Obj_t * pObj;
        int i;
        Vec_PtrForEachEntry( Aig_Obj_t *, p->vUsedNodes, pObj, i )
            Dch_ObjSetSatNum( p, pObj, 0 );
        Vec_PtrClear( p->vUsedNodes );
//        memset( p->pSatVars, 0, sizeof(int) * Aig_ManObjNumMax(p->pAigTotal) );
        sat_solver_delete( p->pSat );
    }
    p->pSat = sat_solver_new();
    sat_solver_setnvars( p->pSat, 1000 );
    // var 0 is not used
    // var 1 is reserved for const1 node - add the clause
    p->nSatVars = 1;
//    p->nSatVars = 0;
    Lit = toLit( p->nSatVars );
    if ( p->pPars->fPolarFlip )
        Lit = lit_neg( Lit );
    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    Dch_ObjSetSatNum( p, Aig_ManConst1(p->pAigFraig), p->nSatVars++ );

    p->nRecycles++;
    p->nCallsSince = 0;
}